

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O2

int ncnn::get_little_cpu_count(void)

{
  int iVar1;
  CpuSet *this;
  
  this = get_cpu_thread_affinity_mask(1);
  iVar1 = CpuSet::num_enabled(this);
  return iVar1;
}

Assistant:

int get_little_cpu_count()
{
    return get_cpu_thread_affinity_mask(1).num_enabled();
}